

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O1

void __thiscall cppcms::widgets::numeric<int>::numeric(numeric<int> *this)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  cppcms::widgets::base_widget::base_widget((base_widget *)&this->field_0x60);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"text","");
  cppcms::widgets::base_html_input::base_html_input
            (&this->super_base_html_input,(string *)&PTR_construction_vtable_24__0012a378);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  *(undefined8 *)this = 0x12a290;
  *(undefined8 *)&this->field_0x60 = 0x12a320;
  this->check_low_ = false;
  this->check_high_ = false;
  this->non_empty_ = false;
  (this->loaded_string_)._M_dataplus._M_p = (pointer)&(this->loaded_string_).field_2;
  (this->loaded_string_)._M_string_length = 0;
  (this->loaded_string_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

numeric() :
				base_html_input("text"),
				check_low_(false),
				check_high_(false),
				non_empty_(false)
			{
			}